

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::ParseWastScript
                 (WastLexer *lexer,
                 unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script,
                 Errors *errors,WastParseOptions *options)

{
  bool bVar1;
  Result RVar2;
  pointer script;
  undefined1 local_118 [8];
  WastParser parser;
  WastParseOptions *options_local;
  Errors *errors_local;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script_local;
  WastLexer *lexer_local;
  
  parser.tokens_._144_8_ = options;
  if (out_script == (unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)0x0) {
    __assert_fail("out_script != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0xf48,
                  "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options != (WastParseOptions *)0x0) {
    WastParser::WastParser((WastParser *)local_118,lexer,errors,options);
    RVar2 = WastParser::ParseScript((WastParser *)local_118,out_script);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&lexer_local + 4),Error);
    }
    else {
      script = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get(out_script);
      RVar2 = ResolveNamesScript(script,errors);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&lexer_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&lexer_local + 4),Ok);
      }
    }
    WastParser::~WastParser((WastParser *)local_118);
    return (Result)lexer_local._4_4_;
  }
  __assert_fail("options != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0xf49,
                "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWastScript(WastLexer* lexer,
                       std::unique_ptr<Script>* out_script,
                       Errors* errors,
                       WastParseOptions* options) {
  assert(out_script != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseScript(out_script));
  CHECK_RESULT(ResolveNamesScript(out_script->get(), errors));
  return Result::Ok;
}